

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index johI,Index t,Index *joIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  int iVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (&this->_m_firstJOHIforT,(ulong)t);
  IVar3 = Globals::CastLIndexToIndex(*pvVar5);
  uVar10 = johI - IVar3;
  uVar6 = (**(code **)((long)*this->_m_madp + 200))();
  auVar11._8_56_ = extraout_var;
  auVar11._0_8_ = extraout_XMM0_Qa;
  auVar2 = vcvtusi2sd_avx512f(auVar11._0_16_,uVar6);
  iVar8 = t - 1;
  for (lVar9 = 0; (ulong)t << 2 != lVar9; lVar9 = lVar9 + 4) {
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,iVar8);
    auVar12._0_8_ = pow(auVar2._0_8_,auVar1._0_8_);
    auVar12._8_56_ = extraout_var_00;
    uVar7 = vcvttsd2usi_avx512f(auVar12._0_16_);
    iVar8 = iVar8 + -1;
    iVar4 = (int)(uVar10 / uVar7);
    *(int *)((long)joIs + lVar9) = iVar4;
    uVar10 = uVar10 - (int)uVar7 * iVar4;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetJointObservationHistoryArrays
    (Index johI, Index t,  Index joIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index johIwithinThisT = johI - CastLIndexToIndex(_m_firstJOHIforT.at(t));
   
    Index remainder = johIwithinThisT;
    size_t vec_size = t; // the number of joint observations we are searching
    size_t nrJO = GetNrJointObservations();
    //size_t nrJA = GetNrJointActions();
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrJO, (double)(stage));
        Index joI_t2 = remainder / b;
        joIs[t2] = joI_t2; 
        remainder -= joI_t2 * b;
    }
}